

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O3

void __thiscall
flatbuffers::lobster::LobsterGenerator::StructBuilderArgs
          (LobsterGenerator *this,StructDef *struct_def,char *nameprefix,string *code_ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FieldDef *name;
  StructDef *struct_def_00;
  char *pcVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  long *plVar6;
  size_type *psVar7;
  undefined8 uVar8;
  ulong uVar9;
  _Alloc_hider _Var10;
  pointer ppFVar11;
  long *local_110;
  long local_100;
  long lStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  LobsterGenerator *local_d0;
  string local_c8;
  string *local_a8;
  char *local_a0;
  string local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  StructDef *local_58;
  string local_50;
  
  ppFVar11 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar11 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar1 = &local_c8.field_2;
    local_d0 = this;
    local_a8 = code_ptr;
    local_a0 = nameprefix;
    local_58 = struct_def;
    do {
      name = *ppFVar11;
      if (((name->value).type.base_type == BASE_TYPE_STRUCT) &&
         (struct_def_00 = (name->value).type.struct_def, struct_def_00->fixed == true)) {
        EscapeKeyword(&local_c8,local_d0,(string *)name);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8);
        pcVar2 = local_a0;
        puVar5 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar5) {
          local_e0 = *puVar5;
          lStack_d8 = plVar3[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *puVar5;
          local_f0 = (ulong *)*plVar3;
        }
        local_e8 = plVar3[1];
        *plVar3 = (long)puVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        strlen(local_a0);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)pcVar2)
        ;
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_100 = *plVar6;
          lStack_f8 = plVar3[3];
          local_110 = &local_100;
        }
        else {
          local_100 = *plVar6;
          local_110 = (long *)*plVar3;
        }
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        StructBuilderArgs(local_d0,struct_def_00,(char *)local_110,local_a8);
        if (local_110 != &local_100) {
          operator_delete(local_110,local_100 + 1);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        uVar8 = local_c8.field_2._M_allocated_capacity;
        _Var10._M_p = local_c8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
LAB_002a0794:
          operator_delete(_Var10._M_p,uVar8 + 1);
        }
      }
      else {
        EscapeKeyword(&local_50,local_d0,(string *)name);
        pcVar2 = local_a0;
        strlen(local_a0);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)pcVar2)
        ;
        local_78 = &local_68;
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_68 = *plVar6;
          lStack_60 = plVar3[3];
        }
        else {
          local_68 = *plVar6;
          local_78 = (long *)*plVar3;
        }
        local_70 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x36cebe);
        psVar7 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_c8.field_2._M_allocated_capacity = *psVar7;
          local_c8.field_2._8_8_ = plVar3[3];
          local_c8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c8.field_2._M_allocated_capacity = *psVar7;
          local_c8._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_c8._M_string_length = plVar3[1];
        *plVar3 = (long)psVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8);
        puVar5 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar5) {
          local_e0 = *puVar5;
          lStack_d8 = plVar3[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *puVar5;
          local_f0 = (ulong *)*plVar3;
        }
        local_e8 = plVar3[1];
        *plVar3 = (long)puVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        LobsterType_abi_cxx11_(&local_98,local_d0,&(name->value).type);
        uVar9 = 0xf;
        if (local_f0 != &local_e0) {
          uVar9 = local_e0;
        }
        if (uVar9 < local_98._M_string_length + local_e8) {
          uVar8 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            uVar8 = local_98.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar8 < local_98._M_string_length + local_e8) goto LAB_002a0589;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_f0);
        }
        else {
LAB_002a0589:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_f0,(ulong)local_98._M_dataplus._M_p);
        }
        plVar3 = puVar4 + 2;
        if ((long *)*puVar4 == plVar3) {
          local_100 = *plVar3;
          lStack_f8 = puVar4[3];
          local_110 = &local_100;
        }
        else {
          local_100 = *plVar3;
          local_110 = (long *)*puVar4;
        }
        *puVar4 = plVar3;
        puVar4[1] = 0;
        *(undefined1 *)plVar3 = 0;
        std::__cxx11::string::_M_append((char *)local_a8,(ulong)local_110);
        if (local_110 != &local_100) {
          operator_delete(local_110,local_100 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
        uVar8 = local_50.field_2._M_allocated_capacity;
        _Var10._M_p = local_50._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_002a0794;
      }
      ppFVar11 = ppFVar11 + 1;
    } while (ppFVar11 !=
             (local_58->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void StructBuilderArgs(const StructDef &struct_def, const char *nameprefix,
                         std::string *code_ptr) {
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (IsStruct(field.value.type)) {
        // Generate arguments for a struct inside a struct. To ensure names
        // don't clash, and to make it obvious these arguments are constructing
        // a nested struct, prefix the name with the field name.
        StructBuilderArgs(*field.value.type.struct_def,
                          (nameprefix + (NormalizedName(field) + "_")).c_str(),
                          code_ptr);
      } else {
        std::string &code = *code_ptr;
        code += ", " + (nameprefix + NormalizedName(field)) + ":" +
                LobsterType(field.value.type);
      }
    }
  }